

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::
LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>
::operator()(LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>
             *this,Vector<tcu::Vector<float,_3>,_3> *a,Vector<tcu::Vector<float,_3>,_3> *b)

{
  bool bVar1;
  Vector<float,_3> *pVVar2;
  Vector<float,_3> *pVVar3;
  int local_2c;
  int i;
  Vector<tcu::Vector<float,_3>,_3> *b_local;
  Vector<tcu::Vector<float,_3>,_3> *a_local;
  LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>_>
  *this_local;
  
  local_2c = 0;
  while( true ) {
    if (2 < local_2c) {
      return false;
    }
    pVVar2 = tcu::Vector<tcu::Vector<float,_3>,_3>::operator[](a,local_2c);
    pVVar3 = tcu::Vector<tcu::Vector<float,_3>,_3>::operator[](b,local_2c);
    bVar1 = LexCompare<tcu::Vector<float,_3>,_3,_std::less<float>_>::operator()
                      ((LexCompare<tcu::Vector<float,_3>,_3,_std::less<float>_> *)this,pVVar2,pVVar3
                      );
    if (bVar1) break;
    pVVar2 = tcu::Vector<tcu::Vector<float,_3>,_3>::operator[](b,local_2c);
    pVVar3 = tcu::Vector<tcu::Vector<float,_3>,_3>::operator[](a,local_2c);
    bVar1 = LexCompare<tcu::Vector<float,_3>,_3,_std::less<float>_>::operator()
                      ((LexCompare<tcu::Vector<float,_3>,_3,_std::less<float>_> *)this,pVVar2,pVVar3
                      );
    if (bVar1) {
      return false;
    }
    local_2c = local_2c + 1;
  }
  return true;
}

Assistant:

bool operator() (const SeqT& a, const SeqT& b) const
	{
		for (int i = 0; i < Size; i++)
		{
			if (m_pred(a[i], b[i]))
				return true;
			if (m_pred(b[i], a[i]))
				return false;
		}
		return false;
	}